

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int line_search(void *vkey,void *ventry)

{
  uintptr_t pc;
  line *entry;
  uintptr_t *key;
  void *ventry_local;
  void *vkey_local;
  undefined4 local_4;
  
  if (*vkey < *ventry) {
    local_4 = -1;
  }
  else if (*vkey < *(ulong *)((long)ventry + 0x18)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
line_search (const void *vkey, const void *ventry)
{
  const uintptr_t *key = (const uintptr_t *) vkey;
  const struct line *entry = (const struct line *) ventry;
  uintptr_t pc;

  pc = *key;
  if (pc < entry->pc)
    return -1;
  else if (pc >= (entry + 1)->pc)
    return 1;
  else
    return 0;
}